

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O0

char * hdr_gettoken(stbi *z,char *buffer)

{
  int iVar1;
  bool bVar2;
  char local_1d;
  int local_1c;
  char c;
  int len;
  char *buffer_local;
  stbi *z_local;
  
  local_1c = 0;
  iVar1 = get8(z);
  local_1d = (char)iVar1;
  while (iVar1 = at_eof(z), iVar1 == 0 && local_1d != '\n') {
    iVar1 = local_1c + 1;
    buffer[local_1c] = local_1d;
    local_1c = iVar1;
    if (iVar1 == 0x3ff) goto LAB_00164745;
    iVar1 = get8(z);
    local_1d = (char)iVar1;
  }
LAB_0016478a:
  buffer[local_1c] = '\0';
  return buffer;
LAB_00164745:
  do {
    iVar1 = at_eof(z);
    bVar2 = false;
    if (iVar1 == 0) {
      iVar1 = get8(z);
      bVar2 = iVar1 != 10;
    }
  } while (bVar2);
  goto LAB_0016478a;
}

Assistant:

static char *hdr_gettoken(stbi *z, char *buffer)
{
   int len=0;
	//char *s = buffer,
	char c = '\0';

   c = get8(z);

	while (!at_eof(z) && c != '\n') {
		buffer[len++] = c;
      if (len == HDR_BUFLEN-1) {
         // flush to end of line
         while (!at_eof(z) && get8(z) != '\n')
            ;
         break;
      }
      c = get8(z);
	}

   buffer[len] = 0;
	return buffer;
}